

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitEnd(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  Name label_00;
  TryTable *this_00;
  If *pIVar1;
  Loop *this_01;
  bool bVar2;
  ScopeCtx *pSVar3;
  Function *pFVar4;
  add_pointer_t<wasm::Function::DebugLocation> __u;
  Block *pBVar5;
  Try *pTVar6;
  Expression **ppEVar7;
  Expression *pEVar8;
  LocalGet *pLVar9;
  ExpressionList *this_02;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  optional<wasm::Type> type__02;
  optional<wasm::Type> type__03;
  optional<wasm::Type> type__04;
  optional<wasm::Type> type__05;
  byte local_3aa;
  Function *local_340;
  Ok local_2d1;
  undefined1 local_2d0 [12];
  TryTable *local_2c0;
  TryTable *trytable;
  undefined1 local_2b0;
  undefined3 uStack_2af;
  Try *local_2a8;
  Try *tryy_1;
  undefined1 local_298;
  undefined3 uStack_297;
  Try *local_290;
  Try *tryy;
  undefined1 local_280;
  undefined3 uStack_27f;
  If *local_278;
  If *iff_1;
  undefined1 local_268;
  undefined3 uStack_267;
  bool local_260;
  undefined7 uStack_25f;
  BasicType local_254;
  If *local_250;
  If *iff;
  undefined1 local_240;
  undefined3 uStack_23f;
  bool local_238;
  undefined7 uStack_237;
  BasicType local_22c;
  char *local_228;
  char *pcStack_220;
  Loop *local_210;
  Loop *loop;
  undefined1 local_200;
  undefined3 uStack_1ff;
  char *local_1f8;
  char *pcStack_1f0;
  Name local_1e8;
  Block *local_1d8;
  Block *block;
  Function *func_1;
  anon_class_32_4_16f8c83c maybeWrapForLabel;
  Type blockType;
  Name *label;
  undefined1 local_190 [7];
  bool isTry;
  Err *local_170;
  Err *err;
  Result<wasm::Expression_*> _val;
  Result<wasm::Expression_*> expr;
  type *loc;
  Function *func;
  Err local_f8;
  undefined1 local_c8 [8];
  ScopeCtx scope;
  IRBuilder *this_local;
  
  scope.startPos = (size_t)this;
  pSVar3 = getScope(this);
  ScopeCtx::ScopeCtx((ScopeCtx *)local_c8,pSVar3);
  bVar2 = ScopeCtx::isNone((ScopeCtx *)local_c8);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"unexpected end",(allocator<char> *)((long)&func + 7));
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_f8);
    wasm::Err::~Err(&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&func + 7));
    func._0_4_ = 1;
  }
  else {
    pFVar4 = ScopeCtx::getFunction((ScopeCtx *)local_c8);
    if ((pFVar4 != (Function *)0x0) &&
       (__u = std::
              get_if<wasm::Function::DebugLocation,wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
                        (&this->debugLoc), __u != (add_pointer_t<wasm::Function::DebugLocation>)0x0)
       ) {
      std::optional<wasm::Function::DebugLocation>::operator=(&pFVar4->epilogLocation,__u);
    }
    std::
    variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
    ::operator=((variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
                 *)&this->debugLoc,
                (CanReceiveDebug *)
                ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x27));
    pBVar5 = ScopeCtx::getBlock((ScopeCtx *)local_c8);
    finishScope((Result<wasm::Expression_*> *)
                ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),this,pBVar5);
    Result<wasm::Expression_*>::Result
              ((Result<wasm::Expression_*> *)&err,
               (Result<wasm::Expression_*> *)
               ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
    local_170 = Result<wasm::Expression_*>::getErr((Result<wasm::Expression_*> *)&err);
    bVar2 = local_170 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err((Err *)local_190,local_170);
      Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)local_190);
      wasm::Err::~Err((Err *)local_190);
    }
    func._0_4_ = (uint)bVar2;
    Result<wasm::Expression_*>::~Result((Result<wasm::Expression_*> *)&err);
    if ((uint)func == 0) {
      pTVar6 = ScopeCtx::getTry((ScopeCtx *)local_c8);
      bVar2 = true;
      if (pTVar6 == (Try *)0x0) {
        pTVar6 = ScopeCtx::getCatch((ScopeCtx *)local_c8);
        bVar2 = true;
        if (pTVar6 == (Try *)0x0) {
          pTVar6 = ScopeCtx::getCatchAll((ScopeCtx *)local_c8);
          bVar2 = pTVar6 != (Try *)0x0;
        }
      }
      if (bVar2) {
        local_340 = (Function *)&scope.label.super_IString.str._M_str;
      }
      else {
        local_340 = (Function *)
                    ((long)&scope.scope.
                            super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                            .
                            super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                            .
                            super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                            .
                            super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                            .
                            super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                    + 0x18);
      }
      maybeWrapForLabel.blockType = (Type *)ScopeCtx::getResultType((ScopeCtx *)local_c8);
      func_1 = local_340;
      maybeWrapForLabel.this = (IRBuilder *)local_c8;
      maybeWrapForLabel.scope = (ScopeCtx *)&maybeWrapForLabel.blockType;
      this->lastBinaryPos = scope._160_8_;
      maybeWrapForLabel.label = (Name *)this;
      block = (Block *)ScopeCtx::getFunction((ScopeCtx *)maybeWrapForLabel.this);
      if ((Function *)block == (Function *)0x0) {
        local_1d8 = ScopeCtx::getBlock((ScopeCtx *)local_c8);
        if (local_1d8 == (Block *)0x0) {
          local_210 = ScopeCtx::getLoop((ScopeCtx *)local_c8);
          if (local_210 == (Loop *)0x0) {
            local_250 = ScopeCtx::getIf((ScopeCtx *)local_c8);
            if (local_250 == (If *)0x0) {
              local_278 = ScopeCtx::getElse((ScopeCtx *)local_c8);
              if (local_278 == (If *)0x0) {
                local_290 = ScopeCtx::getTry((ScopeCtx *)local_c8);
                if (local_290 == (Try *)0x0) {
                  local_2a8 = ScopeCtx::getCatch((ScopeCtx *)local_c8);
                  if ((local_2a8 == (Try *)0x0) &&
                     (local_2a8 = ScopeCtx::getCatchAll((ScopeCtx *)local_c8),
                     local_2a8 == (Try *)0x0)) {
                    local_2c0 = ScopeCtx::getTryTable((ScopeCtx *)local_c8);
                    if (local_2c0 == (TryTable *)0x0) {
                      handle_unreachable("unexpected scope kind",
                                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                                         ,0x46f);
                    }
                    ppEVar7 = Result<wasm::Expression_*>::operator*
                                        ((Result<wasm::Expression_*> *)
                                         ((long)&_val.val.
                                                 super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>
                                         + 0x20));
                    this_00 = local_2c0;
                    local_2c0->body = *ppEVar7;
                    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                              ((optional<wasm::Type> *)local_2d0,
                               &(local_2c0->super_SpecificExpression<(wasm::Expression::Id)53>).
                                super_Expression.type);
                    type__05.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
                    type__05.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._M_payload =
                         (_Storage<wasm::Type,_true>)local_2d0._0_8_;
                    type__05.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_2d0[8];
                    type__05.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._9_3_ = local_2d0._9_3_;
                    TryTable::finalize(this_00,type__05,this->wasm);
                    pEVar8 = visitEnd::anon_class_32_4_16f8c83c::operator()
                                       ((anon_class_32_4_16f8c83c *)&func_1,(Expression *)local_2c0)
                    ;
                    push(this,pEVar8);
                  }
                  else {
                    this_02 = &local_2a8->catchBodies;
                    ppEVar7 = Result<wasm::Expression_*>::operator*
                                        ((Result<wasm::Expression_*> *)
                                         ((long)&_val.val.
                                                 super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>
                                         + 0x20));
                    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                              (&this_02->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,*ppEVar7);
                    wasm::Name::operator=
                              (&local_2a8->name,
                               (Name *)((long)&scope.scope.
                                               super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                               .
                                               super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                               .
                                               super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                               .
                                               super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                               .
                                               super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                       + 0x18));
                    pTVar6 = local_2a8;
                    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                              ((optional<wasm::Type> *)&trytable,
                               &(local_2a8->super_SpecificExpression<(wasm::Expression::Id)52>).
                                super_Expression.type);
                    type__04.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
                    type__04.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._M_payload =
                         (_Storage<wasm::Type,_true>)trytable;
                    type__04.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_2b0;
                    type__04.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._9_3_ = uStack_2af;
                    Try::finalize(pTVar6,type__04);
                    pEVar8 = visitEnd::anon_class_32_4_16f8c83c::operator()
                                       ((anon_class_32_4_16f8c83c *)&func_1,(Expression *)local_2a8)
                    ;
                    push(this,pEVar8);
                  }
                }
                else {
                  ppEVar7 = Result<wasm::Expression_*>::operator*
                                      ((Result<wasm::Expression_*> *)
                                       ((long)&_val.val.
                                               super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>
                                       + 0x20));
                  local_290->body = *ppEVar7;
                  wasm::Name::operator=
                            (&local_290->name,
                             (Name *)((long)&scope.scope.
                                             super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                             .
                                             super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                             .
                                             super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                             .
                                             super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                             .
                                             super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                     + 0x18));
                  pTVar6 = local_290;
                  std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                            ((optional<wasm::Type> *)&tryy_1,
                             &(local_290->super_SpecificExpression<(wasm::Expression::Id)52>).
                              super_Expression.type);
                  type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
                  type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._M_payload =
                       (_Storage<wasm::Type,_true>)tryy_1;
                  type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_298;
                  type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._9_3_ = uStack_297;
                  Try::finalize(pTVar6,type__03);
                  pEVar8 = visitEnd::anon_class_32_4_16f8c83c::operator()
                                     ((anon_class_32_4_16f8c83c *)&func_1,(Expression *)local_290);
                  push(this,pEVar8);
                }
              }
              else {
                ppEVar7 = Result<wasm::Expression_*>::operator*
                                    ((Result<wasm::Expression_*> *)
                                     ((long)&_val.val.
                                             super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>
                                             .super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> +
                                     0x20));
                pIVar1 = local_278;
                local_278->ifFalse = *ppEVar7;
                std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                          ((optional<wasm::Type> *)&tryy,
                           &(local_278->super_SpecificExpression<(wasm::Expression::Id)2>).
                            super_Expression.type);
                type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._12_4_ = 0;
                type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_payload =
                     (_Storage<wasm::Type,_true>)tryy;
                type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_280;
                type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._9_3_ = uStack_27f;
                If::finalize(pIVar1,type__02);
                pEVar8 = visitEnd::anon_class_32_4_16f8c83c::operator()
                                   ((anon_class_32_4_16f8c83c *)&func_1,(Expression *)local_278);
                push(this,pEVar8);
              }
            }
            else {
              ppEVar7 = Result<wasm::Expression_*>::operator*
                                  ((Result<wasm::Expression_*> *)
                                   ((long)&_val.val.
                                           super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> +
                                   0x20));
              local_250->ifTrue = *ppEVar7;
              local_254 = none;
              bVar2 = wasm::Type::operator!=((Type *)&scope.labelUsed,&local_254);
              if (bVar2) {
                local_260 = scope.labelUsed;
                uStack_25f = scope._65_7_;
                pLVar9 = Builder::makeLocalGet
                                   (&this->builder,(Index)scope.inputType.id,(Type)scope._64_8_);
                local_250->ifFalse = (Expression *)pLVar9;
              }
              else {
                local_250->ifFalse = (Expression *)0x0;
              }
              pIVar1 = local_250;
              std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                        ((optional<wasm::Type> *)&iff_1,
                         &(local_250->super_SpecificExpression<(wasm::Expression::Id)2>).
                          super_Expression.type);
              type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._12_4_ = 0;
              type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   (_Storage<wasm::Type,_true>)iff_1;
              type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_268;
              type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._9_3_ = uStack_267;
              If::finalize(pIVar1,type__01);
              pEVar8 = visitEnd::anon_class_32_4_16f8c83c::operator()
                                 ((anon_class_32_4_16f8c83c *)&func_1,(Expression *)local_250);
              push(this,pEVar8);
            }
          }
          else {
            local_228 = (char *)(local_340->super_Importable).super_Named.name.super_IString.str.
                                _M_len;
            pcStack_220 = (local_340->super_Importable).super_Named.name.super_IString.str._M_str;
            ppEVar7 = Result<wasm::Expression_*>::operator*
                                ((Result<wasm::Expression_*> *)
                                 ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>
                                         .super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> +
                                 0x20));
            label_00.super_IString.str._M_str = pcStack_220;
            label_00.super_IString.str._M_len = (size_t)local_228;
            pEVar8 = fixExtraOutput(this,(ScopeCtx *)local_c8,label_00,*ppEVar7);
            local_210->body = pEVar8;
            wasm::Name::operator=
                      (&local_210->name,
                       (Name *)((long)&scope.scope.
                                       super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                       .
                                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                       .
                                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                       .
                                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                       .
                                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                               + 0x18));
            local_22c = none;
            bVar2 = wasm::Type::operator!=((Type *)&scope.labelUsed,&local_22c);
            local_3aa = 0;
            if (bVar2) {
              local_3aa = (byte)scope.branchLabel.super_IString.str._M_str;
            }
            if ((local_3aa & 1) != 0) {
              local_238 = scope.labelUsed;
              uStack_237 = scope._65_7_;
              fixLoopWithInput(this,local_210,(Type)scope._64_8_,(Index)scope.inputType.id);
            }
            this_01 = local_210;
            std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                      ((optional<wasm::Type> *)&iff,
                       &(local_210->super_SpecificExpression<(wasm::Expression::Id)3>).
                        super_Expression.type);
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._12_4_ = 0;
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)iff;
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_240;
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._9_3_ = uStack_23f;
            Loop::finalize(this_01,type__00);
            push(this,(Expression *)local_210);
          }
        }
        else {
          ppEVar7 = Result<wasm::Expression_*>::operator*
                              ((Result<wasm::Expression_*> *)
                               ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20)
                              );
          if ((Block *)*ppEVar7 != local_1d8) {
            __assert_fail("*expr == block",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                          ,0x43d,"Result<> wasm::IRBuilder::visitEnd()");
          }
          wasm::Name::Name(&local_1e8);
          wasm::Name::operator=(&local_1d8->name,&local_1e8);
          local_1f8 = (char *)(local_340->super_Importable).super_Named.name.super_IString.str.
                              _M_len;
          pcStack_1f0 = (local_340->super_Importable).super_Named.name.super_IString.str._M_str;
          pEVar8 = fixExtraOutput(this,(ScopeCtx *)local_c8,
                                  (Name)(local_340->super_Importable).super_Named.name.super_IString
                                        .str,(Expression *)local_1d8);
          local_1d8 = Expression::cast<wasm::Block>(pEVar8);
          wasm::Name::operator=(&local_1d8->name,(Name *)local_340);
          pBVar5 = local_1d8;
          std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                    ((optional<wasm::Type> *)&loop,
                     &(local_1d8->super_SpecificExpression<(wasm::Expression::Id)1>).
                      super_Expression.type);
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._12_4_ = 0;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)loop;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_200;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_3_ = uStack_1ff;
          Block::finalize(pBVar5,type_,
                          NoBreak - ((byte)scope.branchLabel.super_IString.str._M_str & 1));
          push(this,(Expression *)local_1d8);
        }
      }
      else {
        ppEVar7 = Result<wasm::Expression_*>::operator*
                            ((Result<wasm::Expression_*> *)
                             ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
        pEVar8 = visitEnd::anon_class_32_4_16f8c83c::operator()
                           ((anon_class_32_4_16f8c83c *)&func_1,*ppEVar7);
        block[1].list.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        data = (Expression **)pEVar8;
        std::
        unordered_map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
        ::clear(&this->labelDepths);
        bVar2 = ScopeCtx::needsPopFixup((ScopeCtx *)local_c8);
        if (bVar2) {
          EHUtils::handleBlockNestedPops((Function *)block,this->wasm,RunIfNoEH);
        }
        this->func = (Function *)0x0;
        this->blockHint = 0;
        this->labelHint = 0;
      }
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_2d1);
      func._0_4_ = 1;
    }
    Result<wasm::Expression_*>::~Result
              ((Result<wasm::Expression_*> *)
               ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
  }
  ScopeCtx::~ScopeCtx((ScopeCtx *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitEnd() {
  auto scope = getScope();
  if (scope.isNone()) {
    return Err{"unexpected end"};
  }
  if (auto* func = scope.getFunction()) {
    if (auto* loc = std::get_if<Function::DebugLocation>(&debugLoc)) {
      func->epilogLocation = *loc;
    }
  }
  debugLoc = CanReceiveDebug();
  auto expr = finishScope(scope.getBlock());
  CHECK_ERR(expr);

  bool isTry = scope.getTry() || scope.getCatch() || scope.getCatchAll();
  auto& label = isTry ? scope.branchLabel : scope.label;
  auto blockType = scope.getResultType();

  // If the scope expression cannot be directly labeled, we may need to wrap it
  // in a block.
  auto maybeWrapForLabel = [&](Expression* curr) -> Expression* {
    if (!label) {
      return curr;
    }
    curr = fixExtraOutput(scope, label, curr);
    // We can re-use unnamed blocks instead of wrapping them.
    if (auto* block = curr->dynCast<Block>(); block && !block->name) {
      block->name = label;
      block->type = blockType;
      return block;
    }
    auto* block = builder.makeBlock();
    block->name = label;
    block->list.push_back(curr);
    block->finalize(blockType,
                    scope.labelUsed ? Block::HasBreak : Block::NoBreak);
    return block;
  };

  // The binary position we record for the block instruction should start at the
  // beginning of the block, not at the beginning of the `end`.
  lastBinaryPos = scope.startPos;

  if (auto* func = scope.getFunction()) {
    func->body = maybeWrapForLabel(*expr);
    labelDepths.clear();
    if (scope.needsPopFixup()) {
      // We may be in the binary parser, where pops need to be fixed up before
      // we know that EH will be enabled.
      EHUtils::handleBlockNestedPops(
        func, wasm, EHUtils::FeaturePolicy::RunIfNoEH);
    }
    this->func = nullptr;
    blockHint = 0;
    labelHint = 0;
  } else if (auto* block = scope.getBlock()) {
    assert(*expr == block);
    block->name = Name();
    block = fixExtraOutput(scope, label, block)->cast<Block>();
    block->name = label;
    block->finalize(block->type,
                    scope.labelUsed ? Block::HasBreak : Block::NoBreak);
    push(block);
  } else if (auto* loop = scope.getLoop()) {
    loop->body = fixExtraOutput(scope, label, *expr);
    loop->name = scope.label;
    if (scope.inputType != Type::none && scope.labelUsed) {
      // Branches to this loop carry values, but Binaryen IR does not support
      // that. Fix this by trampolining the branches through new code that sets
      // the branch value to the appropriate scratch local.
      fixLoopWithInput(loop, scope.inputType, scope.inputLocal);
    }
    loop->finalize(loop->type);
    push(loop);
  } else if (auto* iff = scope.getIf()) {
    iff->ifTrue = *expr;
    if (scope.inputType != Type::none) {
      // Normally an if without an else must have type none, but if there is an
      // input parameter, the empty else arm must propagate its value.
      // Synthesize an else arm that loads the value from the scratch local.
      iff->ifFalse = builder.makeLocalGet(scope.inputLocal, scope.inputType);
    } else {
      iff->ifFalse = nullptr;
    }
    iff->finalize(iff->type);
    push(maybeWrapForLabel(iff));
  } else if (auto* iff = scope.getElse()) {
    iff->ifFalse = *expr;
    iff->finalize(iff->type);
    push(maybeWrapForLabel(iff));
  } else if (auto* tryy = scope.getTry()) {
    tryy->body = *expr;
    tryy->name = scope.label;
    tryy->finalize(tryy->type);
    push(maybeWrapForLabel(tryy));
  } else if (Try * tryy;
             (tryy = scope.getCatch()) || (tryy = scope.getCatchAll())) {
    tryy->catchBodies.push_back(*expr);
    tryy->name = scope.label;
    tryy->finalize(tryy->type);
    push(maybeWrapForLabel(tryy));
  } else if (auto* trytable = scope.getTryTable()) {
    trytable->body = *expr;
    trytable->finalize(trytable->type, &wasm);
    push(maybeWrapForLabel(trytable));
  } else {
    WASM_UNREACHABLE("unexpected scope kind");
  }
  return Ok{};
}